

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O1

void Cba_ManWriteConcat(Cba_Ntk_t *p,int iObj)

{
  char cVar1;
  uint uVar2;
  int iFon;
  uint uVar3;
  int iVar4;
  Cba_Man_t *pCVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  size_t sVar11;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cba.h"
                  ,0xd5,"Cba_ObjType_t Cba_ObjType(Cba_Ntk_t *, int)");
  }
  if ((p->vObjType).nSize <= iObj) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  if ((p->vObjType).pArray[(uint)iObj] != 'Y') {
    __assert_fail("Cba_ObjIsConcat(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaWriteVer.c"
                  ,0x1ae,"void Cba_ManWriteConcat(Cba_Ntk_t *, int)");
  }
  pCVar5 = p->pDesign;
  uVar9 = (pCVar5->vOut).nCap;
  if ((pCVar5->vOut).nSize == uVar9) {
    if ((int)uVar9 < 0x10) {
      pcVar6 = (pCVar5->vOut).pArray;
      if (pcVar6 == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(pcVar6,0x10);
      }
      (pCVar5->vOut).pArray = pcVar6;
      sVar11 = 0x10;
    }
    else {
      sVar11 = (ulong)uVar9 * 2;
      if ((int)sVar11 <= (int)uVar9) goto LAB_003f4eda;
      pcVar6 = (pCVar5->vOut).pArray;
      if (pcVar6 == (char *)0x0) {
        pcVar6 = (char *)malloc(sVar11);
      }
      else {
        pcVar6 = (char *)realloc(pcVar6,sVar11);
      }
      (pCVar5->vOut).pArray = pcVar6;
    }
    (pCVar5->vOut).nCap = (int)sVar11;
  }
LAB_003f4eda:
  iVar7 = (pCVar5->vOut).nSize;
  (pCVar5->vOut).nSize = iVar7 + 1;
  (pCVar5->vOut).pArray[iVar7] = '{';
  if ((iObj < (p->vObjFin0).nSize) && (uVar9 = iObj + 1, (int)uVar9 < (p->vObjFin0).nSize)) {
    uVar2 = (p->vObjFin0).pArray[(uint)iObj];
    uVar8 = (ulong)uVar2;
    iVar7 = 0;
    do {
      if ((p->vObjFin0).pArray[uVar9] <= (int)uVar8) {
        uVar9 = (pCVar5->vOut).nCap;
        if ((pCVar5->vOut).nSize == uVar9) {
          if ((int)uVar9 < 0x10) {
            pcVar6 = (pCVar5->vOut).pArray;
            if (pcVar6 == (char *)0x0) {
              pcVar6 = (char *)malloc(0x10);
            }
            else {
              pcVar6 = (char *)realloc(pcVar6,0x10);
            }
            sVar11 = 0x10;
          }
          else {
            sVar11 = (ulong)uVar9 * 2;
            if ((int)sVar11 <= (int)uVar9) goto LAB_003f50f3;
            pcVar6 = (pCVar5->vOut).pArray;
            if (pcVar6 == (char *)0x0) {
              pcVar6 = (char *)malloc(sVar11);
            }
            else {
              pcVar6 = (char *)realloc(pcVar6,sVar11);
            }
          }
          (pCVar5->vOut).pArray = pcVar6;
          (pCVar5->vOut).nCap = (int)sVar11;
        }
LAB_003f50f3:
        iVar7 = (pCVar5->vOut).nSize;
        (pCVar5->vOut).nSize = iVar7 + 1;
        (pCVar5->vOut).pArray[iVar7] = '}';
        return;
      }
      if ((int)uVar2 < 1) {
        __assert_fail("f>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cba.h"
                      ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
      }
      if ((p->vFinFon).nSize <= (int)uVar8) break;
      iFon = (p->vFinFon).pArray[uVar8];
      if (iVar7 != 0) {
        lVar10 = 0;
        do {
          cVar1 = "    \"%s\", "[lVar10 + 8];
          uVar3 = (pCVar5->vOut).nCap;
          if ((pCVar5->vOut).nSize == uVar3) {
            if ((int)uVar3 < 0x10) {
              pcVar6 = (pCVar5->vOut).pArray;
              if (pcVar6 == (char *)0x0) {
                pcVar6 = (char *)malloc(0x10);
              }
              else {
                pcVar6 = (char *)realloc(pcVar6,0x10);
              }
              sVar11 = 0x10;
            }
            else {
              sVar11 = (ulong)uVar3 * 2;
              if ((int)sVar11 <= (int)uVar3) goto LAB_003f4ffe;
              pcVar6 = (pCVar5->vOut).pArray;
              if (pcVar6 == (char *)0x0) {
                pcVar6 = (char *)malloc(sVar11);
              }
              else {
                pcVar6 = (char *)realloc(pcVar6,sVar11);
              }
            }
            (pCVar5->vOut).pArray = pcVar6;
            (pCVar5->vOut).nCap = (int)sVar11;
          }
LAB_003f4ffe:
          iVar4 = (pCVar5->vOut).nSize;
          (pCVar5->vOut).nSize = iVar4 + 1;
          (pCVar5->vOut).pArray[iVar4] = cVar1;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 2);
      }
      Cba_ManWriteFonName(p,iFon,1,0);
      uVar8 = uVar8 + 1;
      iVar7 = iVar7 + 1;
    } while ((int)uVar9 < (p->vObjFin0).nSize);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Cba_ManWriteConcat( Cba_Ntk_t * p, int iObj )
{
    int i, iFin, iFon;
    Vec_Str_t * vStr = &p->pDesign->vOut;
    assert( Cba_ObjIsConcat(p, iObj) );
    Vec_StrPush( vStr, '{' );
    Cba_ObjForEachFinFon( p, iObj, iFin, iFon, i )
    {
        Vec_StrPrintStr( vStr, i ? ", " : "" );
        Cba_ManWriteFonName( p, iFon, 1, 0 );
    }
    Vec_StrPush( vStr, '}' );
}